

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<unsigned_long,_void>::load
          (type_caster<unsigned_long,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  long lVar4;
  handle src_00;
  handle src_or_index;
  object tmp;
  object local_28;
  
  if (((src.m_ptr != (PyObject *)0x0) &&
      (iVar2 = _PyObject_TypeCheck(src.m_ptr,(PyTypeObject *)&PyFloat_Type), iVar2 == 0)) &&
     ((convert ||
      ((((src.m_ptr)->ob_type->tp_flags & 0x1000000) != 0 ||
       (iVar2 = PyIndex_Check(src.m_ptr), iVar2 != 0)))))) {
    uVar3 = as_unsigned<unsigned_long>(src.m_ptr);
    if ((uVar3 != 0xffffffffffffffff) || (lVar4 = PyErr_Occurred(), lVar4 == 0)) {
      this->value = uVar3;
      return true;
    }
    PyErr_Clear();
    if ((convert) && (iVar2 = PyNumber_Check(src.m_ptr), iVar2 != 0)) {
      src_00.m_ptr = (PyObject *)PyNumber_Long(src.m_ptr);
      local_28.super_handle.m_ptr = (handle)(handle)src_00.m_ptr;
      PyErr_Clear();
      bVar1 = load(this,src_00,false);
      object::~object(&local_28);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static handle cast(const void *ptr, return_value_policy /* policy */, handle /* parent */) {
        if (ptr) {
            return capsule(ptr).release();
        }
        return none().release();
    }